

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_div.c
# Opt level: O0

int bn_left_align(BIGNUM *num)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long *in_RDI;
  int i;
  int lshift;
  int rshift;
  int top;
  unsigned_long rmask;
  unsigned_long m;
  unsigned_long n;
  unsigned_long *d;
  int local_38;
  ulong local_20;
  
  lVar1 = *in_RDI;
  lVar4 = in_RDI[1];
  iVar5 = BN_num_bits_word(*(ulong *)(lVar1 + (long)((int)lVar4 + -1) * 8));
  uVar3 = -(long)(iVar5 % 0x40);
  local_20 = 0;
  for (local_38 = 0; local_38 < (int)lVar4; local_38 = local_38 + 1) {
    uVar2 = *(ulong *)(lVar1 + (long)local_38 * 8);
    *(ulong *)(lVar1 + (long)local_38 * 8) = uVar2 << ((byte)(0x40 - iVar5) & 0x3f) | local_20;
    local_20 = uVar2 >> ((byte)(iVar5 % 0x40) & 0x3f) & (uVar3 >> 8 | uVar3);
  }
  return 0x40 - iVar5;
}

Assistant:

static int bn_left_align(BIGNUM *num)
{
    BN_ULONG *d = num->d, n, m, rmask;
    int top = num->top;
    int rshift = BN_num_bits_word(d[top - 1]), lshift, i;

    lshift = BN_BITS2 - rshift;
    rshift %= BN_BITS2;            /* say no to undefined behaviour */
    rmask = (BN_ULONG)0 - rshift;  /* rmask = 0 - (rshift != 0) */
    rmask |= rmask >> 8;

    for (i = 0, m = 0; i < top; i++) {
        n = d[i];
        d[i] = ((n << lshift) | m) & BN_MASK2;
        m = (n >> rshift) & rmask;
    }

    return lshift;
}